

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * setVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  mapped_type *this;
  Hcell *pHVar1;
  mapped_type *this_00;
  undefined1 local_58 [52];
  key_type local_24 [2];
  Register r_local;
  
  local_24[0].r = r.r;
  Hcell::ref((Hcell *)local_58,(Hix)(m->h).hix);
  this = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
         operator[](&m->heap,&m->h);
  pHVar1 = Hcell::operator=(this,(Hcell *)local_58);
  this_00 = std::
            map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
            ::operator[](&m->regval,local_24);
  Hcell::operator=(this_00,pHVar1);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  (m->h).hix = (m->h).hix + 1;
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine setVariable(Machine m, Register r) {
    m.regval[r] = m.heap[m.h] = Hcell::ref(m.h);
    m.h += 1;
    return m;
}